

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

string * cmCTest::DecodeURL(string *__return_storage_ptr__,string *in)

{
  int iVar1;
  char local_2b;
  char local_2a;
  undefined1 local_29;
  char *pcStack_28;
  char buf [3];
  char *c;
  string *in_local;
  string *out;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (pcStack_28 = (char *)std::__cxx11::string::c_str(); *pcStack_28 != '\0';
      pcStack_28 = pcStack_28 + 1) {
    if (((*pcStack_28 == '%') && (iVar1 = isxdigit((int)pcStack_28[1]), iVar1 != 0)) &&
       (iVar1 = isxdigit((int)pcStack_28[2]), iVar1 != 0)) {
      local_2b = pcStack_28[1];
      local_2a = pcStack_28[2];
      local_29 = 0;
      strtoul(&local_2b,(char **)0x0,0x10);
      std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
      pcStack_28 = pcStack_28 + 2;
    }
    else {
      std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::DecodeURL(const std::string& in)
{
  std::string out;
  for(const char* c = in.c_str(); *c; ++c)
    {
    if(*c == '%' && isxdigit(*(c+1)) && isxdigit(*(c+2)))
      {
      char buf[3] = {*(c+1), *(c+2), 0};
      out.append(1, char(strtoul(buf, 0, 16)));
      c += 2;
      }
    else
      {
      out.append(1, *c);
      }
    }
  return out;
}